

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O0

void test_font_props(wins *wins_ar,int ar_len)

{
  Am_Drawonable *font_win_00;
  Am_Drawonable *font_win;
  int i;
  Am_Font local_40 [12];
  int local_34;
  int local_30;
  int max_char_descent;
  int max_char_ascent;
  int min_char_width;
  int max_char_width;
  int size;
  int fam;
  int ital;
  int bold;
  int ar_len_local;
  wins *wins_ar_local;
  
  test_string = "Egypt";
  test_str_len = 5;
  fam = 0;
  ital = ar_len;
  _bold = wins_ar;
  do {
    if (1 < fam) {
      return;
    }
    for (size = 0; size < 2; size = size + 1) {
      for (max_char_width = 0; max_char_width < 3; max_char_width = max_char_width + 1) {
        for (min_char_width = 0; min_char_width < 4; min_char_width = min_char_width + 1) {
          Am_Font::Am_Font(local_40,test_font_props::family_array[max_char_width],fam != 0,size != 0
                           ,false,test_font_props::size_array[min_char_width]);
          Am_Font::operator=((Am_Font *)&test_font,local_40);
          Am_Font::~Am_Font(local_40);
          for (font_win._0_4_ = 0; (int)font_win < ital; font_win._0_4_ = (int)font_win + 1) {
            font_win_00 = _bold[(int)font_win].font_win;
            (**(code **)(*(long *)font_win_00 + 0xd8))
                      (font_win_00,&test_font,&max_char_ascent,&max_char_descent,&local_30,&local_34
                      );
            update_font_numbers(font_win_00,false);
            if ((local_30 < test_string_ascent) || (local_34 < test_string_descent)) {
              printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, size=%d\n",
                     (ulong)(uint)fam,(ulong)(uint)size,(ulong)(uint)max_char_width,
                     (ulong)(uint)min_char_width);
              exit(-1);
            }
          }
        }
      }
    }
    fam = fam + 1;
  } while( true );
}

Assistant:

void
test_font_props(wins *wins_ar, int ar_len)
{
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  test_string = "Egypt";
  test_str_len = 5;
  for (int bold = 0; bold < 2; bold++) {
    for (int ital = 0; ital < 2; ital++) {
      for (int fam = 0; fam < 3; fam++) {
        for (int size = 0; size < 4; size++) {
          int max_char_width, min_char_width, max_char_ascent, max_char_descent;
          test_font =
              Am_Font(family_array[fam], bold, ital, false, size_array[size]);
          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            font_win->Get_Font_Properties(test_font, max_char_width,
                                          min_char_width, max_char_ascent,
                                          max_char_descent);
            update_font_numbers(font_win);
            if ((test_string_ascent > max_char_ascent) ||
                (test_string_descent > max_char_descent)) {
              //(test_string_width   < (test_str_len * min_char_width)) || //under Windows, we get aver. char. width
              //as min. char. width
              //(test_string_width   > (test_str_len * max_char_width)))
              printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, "
                     "size=%d\n",
                     bold, ital, fam, size);
              exit(-1);
            }
          }
        }
      }
    }
  }
  //  fprintf(stderr, "test_font_props() passed all standard font tests.\n");
}